

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O1

int AF_AActor_A_SetInventory
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  byte *pbVar1;
  uint uVar2;
  PClassActor *type;
  PClass *pPVar3;
  byte bVar4;
  int iVar5;
  undefined4 extraout_var;
  PClass *pPVar6;
  VMValue *pVVar7;
  AActor *pAVar8;
  AInventory *pAVar9;
  PClassActor *pPVar10;
  uint uVar11;
  char *pcVar12;
  bool bVar13;
  DVector3 local_48;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar12 = "(paramnum) < numparam";
LAB_003cfc05:
    __assert_fail(pcVar12,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x9b3,
                  "int AF_AActor_A_SetInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (((param->field_0).field_3.Type != '\x03') ||
     (((param->field_0).field_1.atag != 1 && ((param->field_0).field_1.a != (void *)0x0)))) {
    pcVar12 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
    goto LAB_003cfc05;
  }
  pAVar8 = (AActor *)(param->field_0).field_1.a;
  if (pAVar8 != (AActor *)0x0) {
    if ((pAVar8->super_DThinker).super_DObject.Class == (PClass *)0x0) {
      iVar5 = (**(pAVar8->super_DThinker).super_DObject._vptr_DObject)(pAVar8);
      (pAVar8->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar5);
    }
    pPVar6 = (pAVar8->super_DThinker).super_DObject.Class;
    bVar13 = pPVar6 != (PClass *)0x0;
    if (pPVar6 != pPVar3 && bVar13) {
      do {
        pPVar6 = pPVar6->ParentClass;
        bVar13 = pPVar6 != (PClass *)0x0;
        if (pPVar6 == pPVar3) break;
      } while (pPVar6 != (PClass *)0x0);
    }
    if (!bVar13) {
      pcVar12 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003cfc05;
    }
  }
  if (numparam == 1) {
    pcVar12 = "(paramnum) < numparam";
LAB_003cfc62:
    __assert_fail(pcVar12,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x9b4,
                  "int AF_AActor_A_SetInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if ((param[1].field_0.field_3.Type != '\x03') ||
     ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0)))) {
    pcVar12 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
    goto LAB_003cfc62;
  }
  type = (PClassActor *)param[1].field_0.field_1.a;
  if ((type != (PClassActor *)0x0) &&
     (pPVar10 = type, type != (PClassActor *)AInventory::RegistrationInfo.MyClass)) {
    do {
      pPVar10 = (PClassActor *)(pPVar10->super_PClass).ParentClass;
      if (pPVar10 == (PClassActor *)AInventory::RegistrationInfo.MyClass) break;
    } while (pPVar10 != (PClassActor *)0x0);
    if (pPVar10 == (PClassActor *)0x0) {
      pcVar12 = "itemtype == NULL || itemtype->IsDescendantOf(RUNTIME_CLASS(AInventory))";
      goto LAB_003cfc62;
    }
  }
  if (numparam < 3) {
    pcVar12 = "(paramnum) < numparam";
LAB_003cfbe6:
    __assert_fail(pcVar12,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x9b5,
                  "int AF_AActor_A_SetInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[2].field_0.field_3.Type != '\0') {
    pcVar12 = "param[paramnum].Type == REGT_INT";
    goto LAB_003cfbe6;
  }
  uVar11 = param[2].field_0.i;
  if (numparam == 3) {
    pVVar7 = defaultparam->Array;
    if (defaultparam->Array[3].field_0.field_3.Type != '\0') {
      pcVar12 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003cfc24:
      __assert_fail(pcVar12,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x9b6,
                    "int AF_AActor_A_SetInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
  }
  else {
    pVVar7 = param;
    if (param[3].field_0.field_3.Type != '\0') {
      pcVar12 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003cfc24;
    }
  }
  if (numparam < 5) {
    param = defaultparam->Array;
    if (param[4].field_0.field_3.Type != '\0') {
      pcVar12 = "(defaultparam[paramnum]).Type == REGT_INT";
      goto LAB_003cfc43;
    }
  }
  else if (param[4].field_0.field_3.Type != '\0') {
    pcVar12 = "(param[paramnum]).Type == REGT_INT";
LAB_003cfc43:
    __assert_fail(pcVar12,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x9b7,
                  "int AF_AActor_A_SetInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (type == (PClassActor *)0x0) {
    if (numret < 1) {
      return 0;
    }
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x9bd,
                    "int AF_AActor_A_SetInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
  }
  else {
    iVar5 = param[4].field_0.i;
    pAVar8 = COPY_AAPTR(pAVar8,pVVar7[3].field_0.i);
    if (pAVar8 == (AActor *)0x0) {
      if (numret < 1) {
        return 0;
      }
      if (ret == (VMReturn *)0x0) {
        __assert_fail("ret != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x9c4,
                      "int AF_AActor_A_SetInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
    }
    else {
      pAVar9 = AActor::FindInventory(pAVar8,type,false);
      if (pAVar9 == (AInventory *)0x0) {
        if ((int)uVar11 < 1) {
          if (numret < 1) {
            return 0;
          }
          if (ret == (VMReturn *)0x0) {
            __assert_fail("ret != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                          ,0x9e9,
                          "int AF_AActor_A_SetInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                         );
          }
        }
        else {
          local_48.X = 0.0;
          local_48.Y = 0.0;
          local_48.Z = 0.0;
          pAVar9 = (AInventory *)AActor::StaticSpawn(type,&local_48,NO_REPLACE,false);
          if (pAVar9 == (AInventory *)0x0) {
            if (numret < 1) {
              return 0;
            }
            if (ret == (VMReturn *)0x0) {
              __assert_fail("ret != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x9ee,
                            "int AF_AActor_A_SetInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
          }
          else {
            pAVar9->Amount = uVar11;
            pbVar1 = (byte *)((long)&(pAVar9->super_AActor).flags.Value + 2);
            *pbVar1 = *pbVar1 | 2;
            pbVar1 = (byte *)((long)&pAVar9->ItemFlags + 1);
            *pbVar1 = *pbVar1 | 0x40;
            AActor::ClearCounters((AActor *)pAVar9);
            bVar13 = AInventory::CallTryPickup(pAVar9,pAVar8,(AActor **)0x0);
            if (bVar13) {
              if (numret < 1) {
                return 0;
              }
              if (ret == (VMReturn *)0x0) {
                __assert_fail("ret != NULL",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                              ,0x9fb,
                              "int AF_AActor_A_SetInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                             );
              }
              goto LAB_003cfaff;
            }
            (*(pAVar9->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])(pAVar9);
            if (numret < 1) {
              return 0;
            }
            if (ret == (VMReturn *)0x0) {
              __assert_fail("ret != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x9f9,
                            "int AF_AActor_A_SetInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
          }
        }
      }
      else {
        uVar2 = pAVar9->Amount;
        if (uVar2 != uVar11) {
          if ((int)uVar11 < 1) {
            iVar5 = (*(pAVar8->super_DThinker).super_DObject._vptr_DObject[0x16])
                              (pAVar8,type,(ulong)uVar2,1,0);
            bVar4 = (byte)iVar5;
            if (numret < 1) {
              return 0;
            }
            if (ret == (VMReturn *)0x0) {
              __assert_fail("ret != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x9d7,
                            "int AF_AActor_A_SetInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
          }
          else if (uVar2 - uVar11 == 0 || (int)uVar2 < (int)uVar11) {
            if ((iVar5 == 0) && (pAVar9->MaxAmount <= (int)uVar11)) {
              uVar11 = pAVar9->MaxAmount;
            }
            pAVar9->Amount = uVar11;
            if (numret < 1) {
              return 0;
            }
            if (ret == (VMReturn *)0x0) {
              __assert_fail("ret != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x9e2,
                            "int AF_AActor_A_SetInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
LAB_003cfaff:
            bVar4 = 1;
          }
          else {
            iVar5 = (*(pAVar8->super_DThinker).super_DObject._vptr_DObject[0x16])
                              (pAVar8,type,(ulong)(uVar2 - uVar11),1,0);
            bVar4 = (byte)iVar5;
            if (numret < 1) {
              return 0;
            }
            if (ret == (VMReturn *)0x0) {
              __assert_fail("ret != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x9dd,
                            "int AF_AActor_A_SetInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
          }
          if (ret->RegType != '\0') goto LAB_003cfb0b;
          goto LAB_003cf941;
        }
        if (numret < 1) {
          return 0;
        }
        if (ret == (VMReturn *)0x0) {
          __assert_fail("ret != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x9d1,
                        "int AF_AActor_A_SetInventory(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
      }
    }
  }
  if (ret->RegType != '\0') {
LAB_003cfb0b:
    __assert_fail("RegType == REGT_INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                  ,0x13f,"void VMReturn::SetInt(int)");
  }
  bVar4 = 0;
LAB_003cf941:
  *(uint *)ret->Location = (uint)bVar4;
  return 1;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SetInventory)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_CLASS(itemtype, AInventory);
	PARAM_INT(amount);
	PARAM_INT_DEF(ptr);
	PARAM_BOOL_DEF(beyondMax);

	bool res = false;

	if (itemtype == nullptr)
	{
		ACTION_RETURN_BOOL(false);
	}

	AActor *mobj = COPY_AAPTR(self, ptr);

	if (mobj == nullptr)
	{
		ACTION_RETURN_BOOL(false);
	}

	AInventory *item = mobj->FindInventory(itemtype);

	if (item != nullptr)
	{
		// A_SetInventory sets the absolute amount. 
		// Subtract or set the appropriate amount as necessary.

		if (amount == item->Amount)
		{
			// Nothing was changed.
			ACTION_RETURN_BOOL(false);
		}
		else if (amount <= 0)
		{
			//Remove it all.
			res = (mobj->TakeInventory(itemtype, item->Amount, true, false));
			ACTION_RETURN_BOOL(res);
		}
		else if (amount < item->Amount)
		{
			int amt = abs(item->Amount - amount);
			res = (mobj->TakeInventory(itemtype, amt, true, false));
			ACTION_RETURN_BOOL(res);
		}
		else
		{
			item->Amount = (beyondMax ? amount : clamp(amount, 0, item->MaxAmount));
			ACTION_RETURN_BOOL(true);
		}
	}
	else
	{
		if (amount <= 0)
		{
			ACTION_RETURN_BOOL(false);
		}
		item = static_cast<AInventory *>(Spawn(itemtype));
		if (item == nullptr)
		{
			ACTION_RETURN_BOOL(false);
		}
		else
		{
			item->Amount = amount;
			item->flags |= MF_DROPPED;
			item->ItemFlags |= IF_IGNORESKILL;
			item->ClearCounters();
			if (!item->CallTryPickup(mobj))
			{
				item->Destroy();
				ACTION_RETURN_BOOL(false);
			}
			ACTION_RETURN_BOOL(true);
		}
	}
	ACTION_RETURN_BOOL(false);
}